

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# escape_string.cpp
# Opt level: O0

string_view __thiscall libtorrent::trim(libtorrent *this,string_view str)

{
  size_type sVar1;
  size_type sVar2;
  basic_string_view<char,_std::char_traits<char>_> bVar3;
  string_view sVar4;
  size_type local_40;
  size_type last;
  size_type first;
  string_view str_local;
  
  str_local._M_len = str._M_len;
  first = (size_type)this;
  sVar1 = ::std::basic_string_view<char,_std::char_traits<char>_>::find_first_not_of
                    ((basic_string_view<char,_std::char_traits<char>_> *)&first," \t\n\r",0);
  sVar2 = ::std::basic_string_view<char,_std::char_traits<char>_>::find_last_not_of
                    ((basic_string_view<char,_std::char_traits<char>_> *)&first," \t\n\r",
                     0xffffffffffffffff);
  local_40 = sVar1;
  if (sVar1 == 0xffffffffffffffff) {
    local_40 = ::std::basic_string_view<char,_std::char_traits<char>_>::size
                         ((basic_string_view<char,_std::char_traits<char>_> *)&first);
  }
  bVar3 = ::std::basic_string_view<char,_std::char_traits<char>_>::substr
                    ((basic_string_view<char,_std::char_traits<char>_> *)&first,local_40,
                     (sVar2 - sVar1) + 1);
  sVar4._M_len = bVar3._M_len;
  sVar4._M_str = bVar3._M_str;
  return sVar4;
}

Assistant:

string_view trim(string_view str)
	{
		auto const first = str.find_first_not_of(" \t\n\r");
		auto const last = str.find_last_not_of(" \t\n\r");
		return str.substr(first == string_view::npos ? str.size() : first, last - first + 1);
	}